

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_24::BinaryReader::PrintError(BinaryReader *this,char *format,...)

{
  Offset OVar1;
  BinaryReaderDelegate *pBVar2;
  _func_int *p_Var3;
  long lVar4;
  char in_AL;
  int iVar5;
  undefined8 in_RCX;
  char *pcVar6;
  undefined8 in_RDX;
  size_t __maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar7;
  char *__s;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_200;
  char local_1f8 [8];
  char fixed_buf [128];
  uint local_170 [2];
  undefined8 local_168;
  undefined8 uStack_160;
  Offset local_158;
  string local_148;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  va_list args;
  string_view local_58;
  undefined8 local_48;
  va_list args_copy;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Da;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  if (this->reading_custom_section_ == true) {
    uVar7 = (uint)this->options_->fail_on_custom_section_error;
  }
  else {
    uVar7 = 1;
  }
  local_78 = 0x3000000010;
  args[0]._0_8_ = &stack0x00000008;
  args[0].overflow_arg_area = local_128;
  local_48 = 0x3000000010;
  __s = local_1f8;
  uStack_200 = 0x178ea8;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  args_copy[0]._0_8_ = args[0]._0_8_;
  args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
  iVar5 = vsnprintf(__s,0x80,format,&local_78);
  __maxlen = (long)iVar5 + 1;
  if (0x80 < __maxlen) {
    lVar4 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
    __s = local_1f8 + lVar4;
    *(undefined8 *)((long)&uStack_200 + lVar4) = 0x178ed7;
    vsnprintf(__s,__maxlen,format,&local_48);
  }
  OVar1 = (this->state_).offset;
  local_168 = 0;
  uStack_160 = 0;
  __s[-8] = -0xe;
  __s[-7] = -0x72;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  local_58.size_ = strlen(__s);
  local_170[0] = uVar7;
  local_158 = OVar1;
  local_58.data_ = __s;
  __s[-8] = '\r';
  __s[-7] = -0x71;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  string_view::to_string_abi_cxx11_(&local_148,&local_58);
  pBVar2 = this->delegate_;
  p_Var3 = pBVar2->_vptr_BinaryReaderDelegate[2];
  __s[-8] = '\x1e';
  __s[-7] = -0x71;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  iVar5 = (*p_Var3)(pBVar2,local_170);
  if ((char)iVar5 == '\0') {
    OVar1 = (this->state_).offset;
    pcVar6 = "error";
    if (uVar7 == 0) {
      pcVar6 = "warning";
    }
    __s[-8] = 'm';
    __s[-7] = -0x71;
    __s[-6] = '\x17';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    fprintf(_stderr,"%07zx: %s: %s\n",OVar1,pcVar6,__s);
  }
  __s[-8] = '*';
  __s[-7] = -0x71;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

BinaryReader::PrintError(const char* format,
                                                       ...) {
  ErrorLevel error_level =
      reading_custom_section_ && !options_.fail_on_custom_section_error
          ? ErrorLevel::Warning
          : ErrorLevel::Error;

  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  Error error(error_level, Location(state_.offset), buffer);
  bool handled = delegate_->OnError(error);

  if (!handled) {
    // Not great to just print, but we don't want to eat the error either.
    fprintf(stderr, "%07" PRIzx ": %s: %s\n", state_.offset,
            GetErrorLevelName(error_level), buffer);
  }
}